

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

bool __thiscall
presolve::HPresolve::fixColToLowerOrUnbounded
          (HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt col)

{
  double fixValue;
  double dVar1;
  bool bVar2;
  int row;
  uint uVar3;
  pointer pdVar4;
  uint uVar5;
  HighsLp *pHVar6;
  double dVar7;
  HighsMatrixSlice<HighsTripletListSlice> local_50;
  
  pHVar6 = this->model;
  fixValue = (pHVar6->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[col];
  if (-INFINITY < fixValue) {
    bVar2 = (this->analysis_).logging_on_;
    if (bVar2 == true) {
      HPresolveAnalysis::startPresolveRuleLog(&this->analysis_,4);
      pHVar6 = this->model;
    }
    local_50.nodeValue =
         (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_50.nodeIndex =
         (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
    local_50.nodeNext =
         (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_start;
    local_50.head =
         (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[col];
    HighsPostsolveStack::fixedColAtLower<HighsTripletListSlice>
              (postsolve_stack,col,fixValue,
               (pHVar6->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[col],&local_50);
    (this->changedColFlag).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_start[col] = '\x01';
    (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[col] = '\x01';
    this->numDeletedCols = this->numDeletedCols + 1;
    uVar5 = (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[col];
    while (uVar5 != 0xffffffff) {
      row = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar5];
      pHVar6 = this->model;
      uVar3 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)uVar5];
      pdVar4 = (pHVar6->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar1 = pdVar4[row];
      dVar7 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[(int)uVar5] * fixValue;
      if (-INFINITY < dVar1) {
        pdVar4[row] = dVar1 - dVar7;
      }
      pdVar4 = (pHVar6->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar1 = pdVar4[row];
      if (dVar1 < INFINITY) {
        pdVar4[row] = dVar1 - dVar7;
      }
      unlink(this,(char *)(ulong)uVar5);
      reinsertEquation(this,row);
      uVar5 = uVar3;
    }
    pHVar6 = this->model;
    pdVar4 = (pHVar6->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pHVar6->offset_ = pdVar4[col] * fixValue + pHVar6->offset_;
    pdVar4[col] = 0.0;
    (this->analysis_).logging_on_ = bVar2;
    if (bVar2 != false) {
      HPresolveAnalysis::stopPresolveRuleLog(&this->analysis_,4);
    }
  }
  return fixValue <= -INFINITY;
}

Assistant:

bool HPresolve::fixColToLowerOrUnbounded(HighsPostsolveStack& postsolve_stack,
                                         HighsInt col) {
  double fixval = model->col_lower_[col];
  if (fixval == -kHighsInf) return true;

  const bool logging_on = analysis_.logging_on_;
  if (logging_on) analysis_.startPresolveRuleLog(kPresolveRuleFixedCol);

  // printf("fixing column %" HIGHSINT_FORMAT " to %.15g\n", col, fixval);

  // mark the column as deleted first so that it is not registered as singleton
  // column upon removing its nonzeros
  postsolve_stack.fixedColAtLower(col, fixval, model->col_cost_[col],
                                  getColumnVector(col));
  markColDeleted(col);

  for (HighsInt coliter = colhead[col]; coliter != -1;) {
    HighsInt colrow = Arow[coliter];
    double colval = Avalue[coliter];
    assert(Acol[coliter] == col);

    HighsInt colpos = coliter;
    coliter = Anext[coliter];

    if (model->row_lower_[colrow] != -kHighsInf)
      model->row_lower_[colrow] -= colval * fixval;

    if (model->row_upper_[colrow] != kHighsInf)
      model->row_upper_[colrow] -= colval * fixval;

    unlink(colpos);

    reinsertEquation(colrow);
  }

  model->offset_ += model->col_cost_[col] * fixval;
  assert(std::isfinite(model->offset_));
  model->col_cost_[col] = 0;
  analysis_.logging_on_ = logging_on;
  if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleFixedCol);
  return false;
}